

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

SetUpTearDownSuiteFuncType
testing::internal::SuiteApiResolver<SignedInt>::GetSetUpCaseOrSuite(char *filename,int line_num)

{
  bool bVar1;
  ostream *poVar2;
  SetUpTearDownSuiteFuncType local_70;
  byte local_3d;
  GTestLog local_2c;
  SetUpTearDownSuiteFuncType local_28;
  SetUpTearDownSuiteFuncType test_suite_fp;
  SetUpTearDownSuiteFuncType test_case_fp;
  char *pcStack_10;
  int line_num_local;
  char *filename_local;
  
  test_case_fp._4_4_ = line_num;
  pcStack_10 = filename;
  test_suite_fp = GetNotDefaultOrNull(Test::SetUpTestCase,Test::SetUpTestCase);
  local_28 = GetNotDefaultOrNull(Test::SetUpTestSuite,Test::SetUpTestSuite);
  local_3d = 1;
  if (test_suite_fp != (SetUpTearDownSuiteFuncType)0x0) {
    local_3d = local_28 != (SetUpTearDownSuiteFuncType)0x0 ^ 0xff;
  }
  bVar1 = IsTrue((bool)(local_3d & 1));
  if (!bVar1) {
    GTestLog::GTestLog(&local_2c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    poVar2 = GTestLog::GetStream(&local_2c);
    poVar2 = std::operator<<(poVar2,"Condition !test_case_fp || !test_suite_fp failed. ");
    poVar2 = std::operator<<(poVar2,
                             "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                            );
    poVar2 = std::operator<<(poVar2,pcStack_10);
    poVar2 = std::operator<<(poVar2,":");
    std::ostream::operator<<(poVar2,test_case_fp._4_4_);
    GTestLog::~GTestLog(&local_2c);
  }
  if (test_suite_fp == (SetUpTearDownSuiteFuncType)0x0) {
    local_70 = local_28;
  }
  else {
    local_70 = test_suite_fp;
  }
  return local_70;
}

Assistant:

static SetUpTearDownSuiteFuncType GetSetUpCaseOrSuite(const char* filename,
                                                        int line_num) {
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
    SetUpTearDownSuiteFuncType test_case_fp =
        GetNotDefaultOrNull(&T::SetUpTestCase, &Test::SetUpTestCase);
    SetUpTearDownSuiteFuncType test_suite_fp =
        GetNotDefaultOrNull(&T::SetUpTestSuite, &Test::SetUpTestSuite);

    GTEST_CHECK_(!test_case_fp || !test_suite_fp)
        << "Test can not provide both SetUpTestSuite and SetUpTestCase, please "
           "make sure there is only one present at "
        << filename << ":" << line_num;

    return test_case_fp != nullptr ? test_case_fp : test_suite_fp;
#else
    (void)(filename);
    (void)(line_num);
    return &T::SetUpTestSuite;
#endif
  }